

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlPatternAdd(xmlPatParserContextPtr ctxt,xmlPatternPtr comp,xmlPatOp op,xmlChar *value,
                 xmlChar *value2)

{
  int iVar1;
  xmlChar *value2_local;
  xmlChar *value_local;
  xmlPatOp op_local;
  xmlPatternPtr comp_local;
  xmlPatParserContextPtr ctxt_local;
  
  if ((comp->nbStep < comp->maxStep) || (iVar1 = xmlPatternGrow(comp), -1 < iVar1)) {
    comp->steps[comp->nbStep].op = op;
    comp->steps[comp->nbStep].value = value;
    comp->steps[comp->nbStep].value2 = value2;
    comp->nbStep = comp->nbStep + 1;
    ctxt_local._4_4_ = 0;
  }
  else {
    ctxt->error = -1;
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlPatternAdd(xmlPatParserContextPtr ctxt, xmlPatternPtr comp,
              xmlPatOp op, xmlChar * value, xmlChar * value2)
{
    if (comp->nbStep >= comp->maxStep) {
        if (xmlPatternGrow(comp) < 0) {
            ctxt->error = -1;
            return(-1);
        }
    }
    comp->steps[comp->nbStep].op = op;
    comp->steps[comp->nbStep].value = value;
    comp->steps[comp->nbStep].value2 = value2;
    comp->nbStep++;
    return(0);
}